

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::UpdateImageOperands::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *param_1,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  bool bVar1;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *this_00;
  uint32_t uVar2;
  uint uVar3;
  const_reference ppCVar4;
  uint local_7c;
  iterator local_78;
  undefined8 local_70;
  SmallVector<unsigned_int,_2UL> local_68;
  uint local_40;
  uint32_t local_3c;
  uint32_t offset_operand_index;
  uint32_t image_operands;
  int32_t operand_index;
  Op opcode;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *param_1_local;
  anon_class_1_0_00000001 *this_local;
  
  _operand_index = constants;
  constants_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)param_1;
  param_1_local = (IRContext *)this;
  image_operands = opt::Instruction::opcode(inst);
  if ((((((((((image_operands == OpImageSampleImplicitLod) ||
             (image_operands == OpImageSampleExplicitLod)) ||
            (image_operands == OpImageSampleDrefImplicitLod)) ||
           ((image_operands == OpImageSampleDrefExplicitLod ||
            (image_operands == OpImageSampleProjImplicitLod)))) ||
          (image_operands == OpImageSampleProjExplicitLod)) ||
         (((image_operands == OpImageSampleProjDrefImplicitLod ||
           (image_operands == OpImageSampleProjDrefExplicitLod)) ||
          ((image_operands == OpImageFetch ||
           (((image_operands == OpImageGather || (image_operands == OpImageDrefGather)) ||
            (image_operands == OpImageRead)))))))) ||
        ((image_operands == OpImageWrite || (image_operands == OpImageSparseSampleImplicitLod)))) ||
       ((image_operands == OpImageSparseSampleExplicitLod ||
        (((image_operands == OpImageSparseSampleDrefImplicitLod ||
          (image_operands == OpImageSparseSampleDrefExplicitLod)) ||
         ((image_operands == OpImageSparseSampleProjImplicitLod ||
          (((image_operands == OpImageSparseSampleProjExplicitLod ||
            (image_operands == OpImageSparseSampleProjDrefImplicitLod)) ||
           (image_operands == OpImageSparseSampleProjDrefExplicitLod)))))))))) ||
      (((image_operands == OpImageSparseFetch || (image_operands == OpImageSparseGather)) ||
       (image_operands == OpImageSparseDrefGather)))) ||
     (bVar1 = false, image_operands == OpImageSparseRead)) {
    bVar1 = true;
  }
  if (bVar1) {
    offset_operand_index = ImageOperandsMaskInOperandIndex((Instruction *)constants_local);
    if ((-1 < (int)offset_operand_index) &&
       (local_3c = opt::Instruction::GetSingleWordInOperand
                             ((Instruction *)constants_local,offset_operand_index),
       (local_3c & 0x10) != 0)) {
      local_40 = offset_operand_index + 1;
      if ((local_3c & 1) != 0) {
        local_40 = offset_operand_index + 2;
      }
      if ((local_3c & 2) != 0) {
        local_40 = local_40 + 1;
      }
      if ((local_3c & 4) != 0) {
        local_40 = local_40 + 2;
      }
      uVar3 = local_40;
      if ((local_3c & 8) != 0) {
        __assert_fail("((image_operands & uint32_t(spv::ImageOperandsMask::ConstOffset)) == 0) && \"Offset and ConstOffset may not be used together\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0xb22,
                      "auto spvtools::opt::(anonymous namespace)::UpdateImageOperands()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
                     );
      }
      uVar2 = opt::Instruction::NumOperands((Instruction *)constants_local);
      if ((uVar3 < uVar2) &&
         (ppCVar4 = std::
                    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ::operator[](_operand_index,(ulong)local_40), *ppCVar4 != (value_type)0x0)) {
        ppCVar4 = std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::operator[](_operand_index,(ulong)local_40);
        uVar3 = (*(*ppCVar4)->_vptr_Constant[0x17])();
        if ((uVar3 & 1) == 0) {
          local_3c = local_3c | 8;
        }
        else {
          opt::Instruction::RemoveInOperand((Instruction *)constants_local,local_40);
        }
        this_00 = constants_local;
        uVar2 = offset_operand_index;
        local_7c = local_3c & 0xffffffef;
        local_78 = &local_7c;
        local_70 = 1;
        init_list._M_len = 1;
        init_list._M_array = local_78;
        local_3c = local_7c;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_68,init_list);
        opt::Instruction::SetInOperand((Instruction *)this_00,uVar2,&local_68);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_68);
        return true;
      }
    }
    return false;
  }
  __assert_fail("(opcode == spv::Op::OpImageSampleImplicitLod || opcode == spv::Op::OpImageSampleExplicitLod || opcode == spv::Op::OpImageSampleDrefImplicitLod || opcode == spv::Op::OpImageSampleDrefExplicitLod || opcode == spv::Op::OpImageSampleProjImplicitLod || opcode == spv::Op::OpImageSampleProjExplicitLod || opcode == spv::Op::OpImageSampleProjDrefImplicitLod || opcode == spv::Op::OpImageSampleProjDrefExplicitLod || opcode == spv::Op::OpImageFetch || opcode == spv::Op::OpImageGather || opcode == spv::Op::OpImageDrefGather || opcode == spv::Op::OpImageRead || opcode == spv::Op::OpImageWrite || opcode == spv::Op::OpImageSparseSampleImplicitLod || opcode == spv::Op::OpImageSparseSampleExplicitLod || opcode == spv::Op::OpImageSparseSampleDrefImplicitLod || opcode == spv::Op::OpImageSparseSampleDrefExplicitLod || opcode == spv::Op::OpImageSparseSampleProjImplicitLod || opcode == spv::Op::OpImageSparseSampleProjExplicitLod || opcode == spv::Op::OpImageSparseSampleProjDrefImplicitLod || opcode == spv::Op::OpImageSparseSampleProjDrefExplicitLod || opcode == spv::Op::OpImageSparseFetch || opcode == spv::Op::OpImageSparseGather || opcode == spv::Op::OpImageSparseDrefGather || opcode == spv::Op::OpImageSparseRead) && \"Wrong opcode.  Should be an image instruction.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xb13,
                "auto spvtools::opt::(anonymous namespace)::UpdateImageOperands()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
               );
}

Assistant:

FoldingRule UpdateImageOperands() {
  return [](IRContext*, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    const auto opcode = inst->opcode();
    (void)opcode;
    assert((opcode == spv::Op::OpImageSampleImplicitLod ||
            opcode == spv::Op::OpImageSampleExplicitLod ||
            opcode == spv::Op::OpImageSampleDrefImplicitLod ||
            opcode == spv::Op::OpImageSampleDrefExplicitLod ||
            opcode == spv::Op::OpImageSampleProjImplicitLod ||
            opcode == spv::Op::OpImageSampleProjExplicitLod ||
            opcode == spv::Op::OpImageSampleProjDrefImplicitLod ||
            opcode == spv::Op::OpImageSampleProjDrefExplicitLod ||
            opcode == spv::Op::OpImageFetch ||
            opcode == spv::Op::OpImageGather ||
            opcode == spv::Op::OpImageDrefGather ||
            opcode == spv::Op::OpImageRead || opcode == spv::Op::OpImageWrite ||
            opcode == spv::Op::OpImageSparseSampleImplicitLod ||
            opcode == spv::Op::OpImageSparseSampleExplicitLod ||
            opcode == spv::Op::OpImageSparseSampleDrefImplicitLod ||
            opcode == spv::Op::OpImageSparseSampleDrefExplicitLod ||
            opcode == spv::Op::OpImageSparseSampleProjImplicitLod ||
            opcode == spv::Op::OpImageSparseSampleProjExplicitLod ||
            opcode == spv::Op::OpImageSparseSampleProjDrefImplicitLod ||
            opcode == spv::Op::OpImageSparseSampleProjDrefExplicitLod ||
            opcode == spv::Op::OpImageSparseFetch ||
            opcode == spv::Op::OpImageSparseGather ||
            opcode == spv::Op::OpImageSparseDrefGather ||
            opcode == spv::Op::OpImageSparseRead) &&
           "Wrong opcode.  Should be an image instruction.");

    int32_t operand_index = ImageOperandsMaskInOperandIndex(inst);
    if (operand_index >= 0) {
      auto image_operands = inst->GetSingleWordInOperand(operand_index);
      if (image_operands & uint32_t(spv::ImageOperandsMask::Offset)) {
        uint32_t offset_operand_index = operand_index + 1;
        if (image_operands & uint32_t(spv::ImageOperandsMask::Bias))
          offset_operand_index++;
        if (image_operands & uint32_t(spv::ImageOperandsMask::Lod))
          offset_operand_index++;
        if (image_operands & uint32_t(spv::ImageOperandsMask::Grad))
          offset_operand_index += 2;
        assert(((image_operands &
                 uint32_t(spv::ImageOperandsMask::ConstOffset)) == 0) &&
               "Offset and ConstOffset may not be used together");
        if (offset_operand_index < inst->NumOperands()) {
          if (constants[offset_operand_index]) {
            if (constants[offset_operand_index]->IsZero()) {
              inst->RemoveInOperand(offset_operand_index);
            } else {
              image_operands = image_operands |
                               uint32_t(spv::ImageOperandsMask::ConstOffset);
            }
            image_operands =
                image_operands & ~uint32_t(spv::ImageOperandsMask::Offset);
            inst->SetInOperand(operand_index, {image_operands});
            return true;
          }
        }
      }
    }

    return false;
  };
}